

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.hpp
# Opt level: O0

mat3x2f * __thiscall Triangle::jacobi(mat3x2f *__return_storage_ptr__,Triangle *this)

{
  vec3f vVar1;
  vec2f local_98;
  vec2f local_90;
  mat2f local_88;
  mat2f local_78;
  vec3f local_68;
  vec3f local_58;
  vec3f local_48;
  vec3f local_38;
  mat3x2f local_28;
  Triangle *local_10;
  Triangle *this_local;
  
  local_10 = this;
  vVar1 = ::operator-(&this->v2,&this->v1);
  local_48.z = vVar1.z;
  local_38.z = local_48.z;
  local_48._0_8_ = vVar1._0_8_;
  local_38.x = local_48.x;
  local_38.y = local_48.y;
  local_48 = vVar1;
  vVar1 = ::operator-(&this->v3,&this->v1);
  local_68.z = vVar1.z;
  local_58.z = local_68.z;
  local_68._0_8_ = vVar1._0_8_;
  local_58.x = local_68.x;
  local_58.y = local_68.y;
  local_68 = vVar1;
  mat3x2f::mat3x2f(&local_28,&local_38,&local_58);
  local_90 = ::operator-(&this->vt2,&this->vt1);
  local_98 = ::operator-(&this->vt3,&this->vt1);
  mat2f::mat2f(&local_88,&local_90,&local_98);
  local_78 = inverse(local_88);
  ::operator*(__return_storage_ptr__,&local_28,&local_78);
  return __return_storage_ptr__;
}

Assistant:

mat3x2f jacobi() const // [dpdu dpdv]
	{
		return mat3x2f(v2-v1, v3-v1) * inverse(mat2f(vt2-vt1, vt3-vt1));
	}